

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Maybe<kj::Promise<unsigned_long>_> __thiscall
kj::anon_unknown_36::HttpChunkedEntityWriter::tryPumpFrom
          (HttpChunkedEntityWriter *this,AsyncInputStream *input,uint64_t amount)

{
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar1;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX;
  Maybe<kj::Promise<unsigned_long>_> MVar2;
  undefined1 local_68 [16];
  unsigned_long *l;
  Maybe<unsigned_long> local_48;
  undefined1 local_38 [8];
  NullableValue<unsigned_long> _l2595;
  uint64_t amount_local;
  AsyncInputStream *input_local;
  HttpChunkedEntityWriter *this_local;
  
  (**(code **)(*(long *)amount + 0x10))();
  other = kj::_::readMaybe<unsigned_long>(&local_48);
  kj::_::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_38,other)
  ;
  Maybe<unsigned_long>::~Maybe(&local_48);
  puVar1 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_38);
  if (puVar1 == (unsigned_long *)0x0) {
    Maybe<kj::Promise<unsigned_long>_>::Maybe((Maybe<kj::Promise<unsigned_long>_> *)this);
  }
  else {
    local_68._8_8_ =
         kj::_::NullableValue<unsigned_long>::operator*((NullableValue<unsigned_long> *)local_38);
    min<unsigned_long&,unsigned_long&>(&_l2595.field_1.value,(unsigned_long *)local_68._8_8_);
    pumpImpl((HttpChunkedEntityWriter *)local_68,input,amount);
    Maybe<kj::Promise<unsigned_long>_>::Maybe
              ((Maybe<kj::Promise<unsigned_long>_> *)this,(Promise<unsigned_long> *)local_68);
    Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)local_68);
  }
  kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_38);
  MVar2.ptr.field_1 = extraout_RDX;
  MVar2.ptr._0_8_ = this;
  return (Maybe<kj::Promise<unsigned_long>_>)MVar2.ptr;
}

Assistant:

Maybe<Promise<uint64_t>> tryPumpFrom(AsyncInputStream& input, uint64_t amount) override {
    KJ_IF_SOME(l, input.tryGetLength()) {
      return pumpImpl(input, kj::min(amount, l));
    } else {
      // Need to use naive read/write loop.
      return kj::none;
    }